

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

void __thiscall miniros::RPCManager::releaseXMLRPCClient(RPCManager *this,XmlRpcClient *c)

{
  bool bVar1;
  pointer pCVar2;
  XmlRpcClient *in_RSI;
  long in_RDI;
  iterator i;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff88;
  __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
  *in_stack_ffffffffffffff90;
  atomic<bool> *in_stack_ffffffffffffff98;
  XmlRpcClient *this_00;
  const_iterator __position;
  __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
  local_20 [2];
  XmlRpcClient *local_10;
  
  local_10 = in_RSI;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_20[0]._M_current =
       (CachedXmlRpcClient *)
       std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>::begin
                 ((vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                   *)in_stack_ffffffffffffff88);
  do {
    std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>::end
              ((vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_> *)
               in_stack_ffffffffffffff88);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff90,
                       (__normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
LAB_00497e65:
      std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x497e6f);
      return;
    }
    __position._M_current = (CachedXmlRpcClient *)local_10;
    pCVar2 = __gnu_cxx::
             __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
             ::operator->(local_20);
    if ((XmlRpcClient *)__position._M_current == pCVar2->client_) {
      bVar1 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffff98);
      if (bVar1) {
        pCVar2 = __gnu_cxx::
                 __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                 ::operator->(local_20);
        (*(pCVar2->client_->super_XmlRpcSource)._vptr_XmlRpcSource[2])();
        pCVar2 = __gnu_cxx::
                 __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                 ::operator->(local_20);
        this_00 = pCVar2->client_;
        if (this_00 != (XmlRpcClient *)0x0) {
          (*(this_00->super_XmlRpcSource)._vptr_XmlRpcSource[1])();
        }
        __gnu_cxx::
        __normal_iterator<miniros::CachedXmlRpcClient_const*,std::vector<miniros::CachedXmlRpcClient,std::allocator<miniros::CachedXmlRpcClient>>>
        ::__normal_iterator<miniros::CachedXmlRpcClient*>
                  ((__normal_iterator<const_miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                    *)(in_RDI + 0xd0),
                   (__normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                    *)in_stack_ffffffffffffff88);
        std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>::
        erase((vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_> *)
              this_00,__position);
      }
      else {
        pCVar2 = __gnu_cxx::
                 __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
                 ::operator->(local_20);
        pCVar2->in_use_ = false;
      }
      goto LAB_00497e65;
    }
    __gnu_cxx::
    __normal_iterator<miniros::CachedXmlRpcClient_*,_std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>_>
    ::operator++(local_20);
  } while( true );
}

Assistant:

void RPCManager::releaseXMLRPCClient(XmlRpcClient *c)
{
  std::scoped_lock<std::mutex> lock(clients_mutex_);

  for (auto i = clients_.begin(); i != clients_.end(); ++i)
  {
    if (c == i->client_)
    {
      if (shutting_down_)
      {
        // if we are shutting down we won't be re-using the client
        i->client_->close();
        delete i->client_;
        clients_.erase(i);
      }
      else
      {
        i->in_use_ = false;
      }
      break;
    }
  }
}